

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O0

void __thiscall UniValue::UniValue(UniValue *this,bool val_)

{
  bool val__local;
  UniValue *this_local;
  
  std::__cxx11::string::string((string *)&this->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&this->values);
  ::UniValue::setBool(SUB81(this,0));
  return;
}

Assistant:

UniValue(bool val_) {
        setBool(val_);
    }